

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O0

void __thiscall QSyntaxHighlighter::rehighlightBlock(QSyntaxHighlighter *this,QTextBlock *block)

{
  bool bVar1;
  byte bVar2;
  QSyntaxHighlighterPrivate *this_00;
  QTextBlock *in_RSI;
  QTextCursor *in_RDI;
  long in_FS_OFFSET;
  bool rehighlightPending;
  QSyntaxHighlighterPrivate *d;
  QTextCursor cursor;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffffcf;
  MoveOperation operation;
  QTextDocument *in_stack_fffffffffffffff0;
  QSyntaxHighlighterPrivate *this_01;
  
  this_01 = *(QSyntaxHighlighterPrivate **)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSyntaxHighlighter *)0x79b01a);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QTextDocument> *)0x79b02d);
  uVar3 = true;
  if (bVar1) {
    bVar1 = QTextBlock::isValid((QTextBlock *)this_00);
    uVar3 = true;
    if (bVar1) {
      in_stack_fffffffffffffff0 = QTextBlock::document((QTextBlock *)this_00);
      uVar3 = ::operator!=((QTextDocument **)this_00,
                           (QPointer<QTextDocument> *)
                           CONCAT17(in_stack_ffffffffffffffcf,
                                    CONCAT16(uVar3,in_stack_ffffffffffffffc8)));
    }
  }
  if ((bool)uVar3 == false) {
    bVar2 = this_00->rehighlightPending & 1;
    operation = 0xaaaaaaaa;
    QTextCursor::QTextCursor(in_RDI,in_RSI);
    QSyntaxHighlighterPrivate::rehighlight
              (this_01,(QTextCursor *)in_stack_fffffffffffffff0,operation);
    if ((bVar2 & 1) != 0) {
      this_00->rehighlightPending = (bool)(bVar2 & 1);
    }
    QTextCursor::~QTextCursor((QTextCursor *)0x79b0ea);
  }
  if (*(QSyntaxHighlighterPrivate **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSyntaxHighlighter::rehighlightBlock(const QTextBlock &block)
{
    Q_D(QSyntaxHighlighter);
    if (!d->doc || !block.isValid() || block.document() != d->doc)
        return;

    const bool rehighlightPending = d->rehighlightPending;

    QTextCursor cursor(block);
    d->rehighlight(cursor, QTextCursor::EndOfBlock);

    if (rehighlightPending)
        d->rehighlightPending = rehighlightPending;
}